

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSettingsAddSettingsHandler(void)

{
  undefined1 local_50 [8];
  ImGuiSettingsHandler ini_handler;
  
  ImGuiSettingsHandler::ImGuiSettingsHandler((ImGuiSettingsHandler *)local_50);
  local_50 = (undefined1  [8])0x2bc540;
  ini_handler.TypeName._0_4_ = ImHashStr("Table",0,0);
  ini_handler._8_8_ = TableSettingsHandler_ClearAll;
  ini_handler.ReadInitFn = TableSettingsHandler_ReadOpen;
  ini_handler.ReadOpenFn = TableSettingsHandler_ReadLine;
  ini_handler.ReadLineFn = TableSettingsHandler_ApplyAll;
  ini_handler.ApplyAllFn = TableSettingsHandler_WriteAll;
  AddSettingsHandler((ImGuiSettingsHandler *)local_50);
  return;
}

Assistant:

void ImGui::TableSettingsAddSettingsHandler()
{
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Table";
    ini_handler.TypeHash = ImHashStr("Table");
    ini_handler.ClearAllFn = TableSettingsHandler_ClearAll;
    ini_handler.ReadOpenFn = TableSettingsHandler_ReadOpen;
    ini_handler.ReadLineFn = TableSettingsHandler_ReadLine;
    ini_handler.ApplyAllFn = TableSettingsHandler_ApplyAll;
    ini_handler.WriteAllFn = TableSettingsHandler_WriteAll;
    AddSettingsHandler(&ini_handler);
}